

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPlistParser.cxx
# Opt level: O0

optional<Json::Value> * cmParsePlist(optional<Json::Value> *__return_storage_ptr__,string *filename)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int fd;
  Status *pSVar2;
  uv_loop_t *loop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4f0;
  undefined1 local_478 [8];
  cmUVPipeIStream outputStream;
  Value value;
  Reader reader;
  Status *status;
  cmUVProcessChain chain;
  allocator<char> local_180;
  allocator<char> local_17f;
  allocator<char> local_17e;
  allocator<char> local_17d [20];
  allocator<char> local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  iterator local_a0;
  size_type local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  undefined1 local_78 [8];
  cmUVProcessChainBuilder builder;
  string *filename_local;
  
  builder.Loop = (uv_loop_t *)filename;
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_78);
  chain.Data._M_t.
  super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
  .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._7_1_ = 1;
  local_168 = &local_160;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"/usr/bin/plutil",&local_169);
  local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"-convert",local_17d);
  local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"json",&local_17e);
  local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"-o",&local_17f);
  local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"-",&local_180);
  local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
  std::__cxx11::string::string((string *)local_168,(string *)builder.Loop);
  chain.Data._M_t.
  super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
  .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._7_1_ = 0;
  local_a0 = &local_160;
  local_98 = 6;
  this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&chain.Data._M_t.
                    super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                    .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 6);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this);
  __l._M_len = local_98;
  __l._M_array = local_a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_90,__l,this);
  cmUVProcessChainBuilder::AddCommand((cmUVProcessChainBuilder *)local_78,&local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&chain.Data._M_t.
                        super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                        .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 6));
  local_4f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0;
  do {
    local_4f0 = local_4f0 + -1;
    std::__cxx11::string::~string((string *)local_4f0);
  } while (local_4f0 != &local_160);
  std::allocator<char>::~allocator(&local_180);
  std::allocator<char>::~allocator(&local_17f);
  std::allocator<char>::~allocator(&local_17e);
  std::allocator<char>::~allocator(local_17d);
  std::allocator<char>::~allocator(&local_169);
  cmUVProcessChainBuilder::SetBuiltinStream((cmUVProcessChainBuilder *)local_78,Stream_OUTPUT);
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&status);
  cmUVProcessChain::Wait((cmUVProcessChain *)&status,0);
  pSVar2 = cmUVProcessChain::GetStatus((cmUVProcessChain *)&status,0);
  if (pSVar2->ExitStatus == 0) {
    Json::Reader::Reader((Reader *)&value.limit_);
    Json::Value::Value((Value *)&outputStream.field_0x198,nullValue);
    loop = cmUVProcessChain::GetLoop((cmUVProcessChain *)&status);
    fd = cmUVProcessChain::OutputStream((cmUVProcessChain *)&status);
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::cmBasicUVPipeIStream
              ((cmBasicUVPipeIStream<char,_std::char_traits<char>_> *)local_478,loop,fd);
    bVar1 = Json::Reader::parse((Reader *)&value.limit_,(istream *)local_478,
                                (Value *)&outputStream.field_0x198,true);
    if (bVar1) {
      std::optional<Json::Value>::optional<Json::Value_&,_true>
                (__return_storage_ptr__,(Value *)&outputStream.field_0x198);
    }
    else {
      std::optional<Json::Value>::optional(__return_storage_ptr__);
    }
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::~cmBasicUVPipeIStream
              ((cmBasicUVPipeIStream<char,_std::char_traits<char>_> *)local_478);
    Json::Value::~Value((Value *)&outputStream.field_0x198);
    Json::Reader::~Reader((Reader *)&value.limit_);
  }
  else {
    std::optional<Json::Value>::optional(__return_storage_ptr__);
  }
  cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)&status);
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_78);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<Json::Value> cmParsePlist(const std::string& filename)
{
  cmUVProcessChainBuilder builder;
  builder.AddCommand(
    { "/usr/bin/plutil", "-convert", "json", "-o", "-", filename });
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT);

  auto chain = builder.Start();
  chain.Wait();

  auto const& status = chain.GetStatus(0);
  if (status.ExitStatus != 0) {
    return cm::nullopt;
  }

  Json::Reader reader;
  Json::Value value;
  cmUVPipeIStream outputStream(chain.GetLoop(), chain.OutputStream());
  if (!reader.parse(outputStream, value)) {
    return cm::nullopt;
  }
  return cm::optional<Json::Value>(value);
}